

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int arg_hashtable_itr_remove(arg_hashtable_itr_t *itr)

{
  uint *puVar1;
  arg_hashtable_entry *paVar2;
  int iVar3;
  arg_hashtable_entry *__ptr;
  
  __ptr = itr->e;
  if (itr->parent == (arg_hashtable_entry *)0x0) {
    itr->h->table[itr->index] = __ptr->next;
    __ptr = itr->e;
  }
  else {
    itr->parent->next = __ptr->next;
  }
  puVar1 = &itr->h->entrycount;
  *puVar1 = *puVar1 - 1;
  free(__ptr->k);
  free(__ptr->v);
  paVar2 = itr->parent;
  iVar3 = arg_hashtable_itr_advance(itr);
  if (itr->parent == __ptr) {
    itr->parent = paVar2;
  }
  free(__ptr);
  return iVar3;
}

Assistant:

int arg_hashtable_itr_remove(arg_hashtable_itr_t* itr) {
    struct arg_hashtable_entry* remember_e;
    struct arg_hashtable_entry* remember_parent;
    int ret;

    /* Do the removal */
    if ((itr->parent) == NULL) {
        /* element is head of a chain */
        itr->h->table[itr->index] = itr->e->next;
    } else {
        /* element is mid-chain */
        itr->parent->next = itr->e->next;
    }
    /* itr->e is now outside the hashtable */
    remember_e = itr->e;
    itr->h->entrycount--;
    xfree(remember_e->k);
    xfree(remember_e->v);

    /* Advance the iterator, correcting the parent */
    remember_parent = itr->parent;
    ret = arg_hashtable_itr_advance(itr);
    if (itr->parent == remember_e) {
        itr->parent = remember_parent;
    }
    xfree(remember_e);
    return ret;
}